

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<TPZEqnArray<long_double>,_10> * __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::operator=
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,
          TPZManVector<TPZEqnArray<long_double>,_10> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TPZEqnArray<long_double> *pTVar3;
  undefined1 auVar4 [16];
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  TPZEqnArray<long_double> *pTVar9;
  ulong uVar10;
  
  if (this != copy) {
    uVar10 = (copy->super_TPZVec<TPZEqnArray<long_double>_>).fNElements;
    if (((this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc < (long)uVar10) &&
       (pTVar9 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore,
       pTVar9 != (TPZEqnArray<long_double> *)&this->field_0x20 &&
       pTVar9 != (TPZEqnArray<long_double> *)0x0)) {
      lVar6 = *(long *)&pTVar9[-1].field_0x51d8;
      if (lVar6 != 0) {
        lVar8 = lVar6 * 0x51e0;
        do {
          TPZEqnArray<long_double>::~TPZEqnArray
                    ((TPZEqnArray<long_double> *)
                     ((long)pTVar9[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar8 + -0x28));
          lVar8 = lVar8 + -0x51e0;
        } while (lVar8 != 0);
      }
      operator_delete__(&pTVar9[-1].fLastTerm,lVar6 * 0x51e0 | 0x10);
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = (TPZEqnArray<long_double> *)0x0;
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
    }
    if ((long)uVar10 < 0xb) {
      pTVar9 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
      if (pTVar9 != (TPZEqnArray<long_double> *)0x0 &&
          pTVar9 != (TPZEqnArray<long_double> *)&this->field_0x20) {
        lVar6 = *(long *)&pTVar9[-1].field_0x51d8;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x51e0;
          do {
            TPZEqnArray<long_double>::~TPZEqnArray
                      ((TPZEqnArray<long_double> *)
                       ((long)pTVar9[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                       lVar8 + -0x28));
            lVar8 = lVar8 + -0x51e0;
          } while (lVar8 != 0);
        }
        operator_delete__(&pTVar9[-1].fLastTerm,lVar6 * 0x51e0 | 0x10);
      }
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore =
           (TPZEqnArray<long_double> *)&this->field_0x20;
    }
    else if ((this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc < (long)uVar10) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar10;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x51e0),8) == 0) {
        uVar7 = SUB168(auVar4 * ZEXT816(0x51e0),0) | 0x10;
      }
      pvVar5 = operator_new__(uVar7);
      *(ulong *)((long)pvVar5 + 8) = uVar10;
      lVar6 = 0;
      pTVar9 = (TPZEqnArray<long_double> *)((long)pvVar5 + 0x10);
      do {
        TPZEqnArray<long_double>::TPZEqnArray(pTVar9);
        lVar6 = lVar6 + -0x51e0;
        pTVar9 = pTVar9 + 1;
      } while (uVar10 * -0x51e0 - lVar6 != 0);
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore =
           (TPZEqnArray<long_double> *)((long)pvVar5 + 0x10);
      (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = uVar10;
    }
    (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = uVar10;
    if (0 < (long)uVar10) {
      lVar6 = 0;
      do {
        pTVar9 = (copy->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
        pTVar3 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
        puVar1 = (undefined8 *)
                 ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28);
        puVar2 = (undefined8 *)
                 ((long)(pTVar3->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28);
        *puVar2 = *puVar1;
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar3->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20
                   ),(TPZManVector<int,_100> *)
                     ((long)(pTVar9->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar6 + -0x20));
        TPZManVector<long_double,_1000>::operator=
                  ((TPZManVector<long_double,_1000> *)
                   ((long)(pTVar3->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar6 + -0x20),
                   (TPZManVector<long_double,_1000> *)
                   ((long)(pTVar9->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar6 + -0x20));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar3->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20),
                   (TPZManVector<int,_1000> *)
                   ((long)(pTVar9->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20))
        ;
        *(undefined4 *)(puVar2 + 0xa3a) = *(undefined4 *)(puVar1 + 0xa3a);
        lVar6 = lVar6 + 0x51e0;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}